

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aspa.c
# Opt level: O2

aspa_status aspa_table_remove_node(aspa_table *aspa_table,aspa_store_node **node,_Bool notify)

{
  long lVar1;
  aspa_store_node *paVar2;
  aspa_array *array;
  rtr_socket *rtr_socket;
  aspa_record *record;
  aspa_status aVar3;
  size_t i;
  ulong index;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (node == (aspa_store_node **)0x0) {
    aVar3 = ASPA_ERROR;
  }
  else {
    paVar2 = *node;
    aVar3 = ASPA_SUCCESS;
    if (paVar2 != (aspa_store_node *)0x0) {
      array = paVar2->aspa_array;
      rtr_socket = paVar2->rtr_socket;
      aspa_store_remove_node(node);
      if (array != (aspa_array *)0x0) {
        if (notify) {
          for (index = 0; index < array->size; index = index + 1) {
            record = aspa_array_get_record(array,index);
            aspa_table_notify_clients(aspa_table,record,rtr_socket,ASPA_REMOVE);
          }
        }
        aspa_array_free(array,true);
        aVar3 = ASPA_SUCCESS;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return aVar3;
  }
  __stack_chk_fail();
}

Assistant:

static enum aspa_status aspa_table_remove_node(struct aspa_table *aspa_table, struct aspa_store_node **node,
					       bool notify)
{
	if (!node)
		return ASPA_ERROR;

	if (!*node)
		// Doesn't exist anymore
		return ASPA_SUCCESS;

	struct aspa_array *array = (*node)->aspa_array;
	struct rtr_socket *socket = (*node)->rtr_socket;

	// Remove node for socket
	aspa_store_remove_node(node);

	if (!array)
		// Doesn't exist anymore
		return ASPA_SUCCESS;

	// Notify clients about these records being removed
	if (notify) {
		for (size_t i = 0; i < array->size; i++)
			aspa_table_notify_clients(aspa_table, aspa_array_get_record(array, i), socket, false);
	}

	// Release all records and their provider sets
	aspa_array_free(array, true);

	return ASPA_SUCCESS;
}